

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

Value * __thiscall GlobOptBlockData::SetValue(GlobOptBlockData *this,Value *val,Opnd *opnd)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  Sym *sym;
  uint lineNumber;
  
  if (opnd == (Opnd *)0x0) {
    return val;
  }
  OVar2 = IR::Opnd::GetKind(opnd);
  if (OVar2 == OpndKindReg) {
    OVar2 = IR::Opnd::GetKind(opnd);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      error = "(this->IsRegOpnd())";
      message = "Bad call to AsRegOpnd()";
      lineNumber = 0x79;
LAB_0049aff3:
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,lineNumber,error,message);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    if (OVar2 != OpndKindSym) {
      sym = (Sym *)0x0;
      goto LAB_0049b00c;
    }
    OVar2 = IR::Opnd::GetKind(opnd);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      error = "(this->IsSymOpnd())";
      message = "Bad call to AsSymOpnd()";
      lineNumber = 0x45;
      goto LAB_0049aff3;
    }
  }
  sym = (Sym *)opnd[1]._vptr_Opnd;
LAB_0049b00c:
  if (sym != (Sym *)0x0) {
    SetValue(this,val,sym);
  }
  return val;
}

Assistant:

Value *
GlobOptBlockData::SetValue(Value *val, IR::Opnd *opnd)
{
    if (opnd)
    {
        Sym *sym;
        switch (opnd->GetKind())
        {
        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            break;

        case IR::OpndKindReg:
            sym = opnd->AsRegOpnd()->m_sym;
            break;

        default:
            sym = nullptr;
        }
        if (sym)
        {
            this->SetValue(val, sym);
        }
    }

    return val;
}